

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs5.c
# Opt level: O1

int mbedtls_pkcs5_pbkdf2_hmac
              (mbedtls_md_context_t *ctx,uchar *password,size_t plen,uchar *salt,size_t slen,
              uint iteration_count,uint32_t key_length,uchar *output)

{
  uchar *puVar1;
  uint uVar2;
  size_t ilen;
  byte bVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong __n;
  uchar work [64];
  uchar md1 [64];
  uint32_t local_e4;
  uchar local_e0 [4];
  uint local_dc;
  uchar *local_d8;
  size_t local_d0;
  size_t local_c8;
  uchar *local_c0;
  byte local_b8 [64];
  byte local_78 [72];
  
  local_d0 = plen;
  local_c0 = salt;
  bVar3 = mbedtls_md_get_size(ctx->md_info);
  local_e0[0] = '\0';
  local_e0[1] = '\0';
  local_e0[2] = '\0';
  local_e0[3] = '\x01';
  local_e4 = key_length;
  if (key_length != 0) {
    local_d8 = output;
    __n = (ulong)bVar3;
    local_dc = iteration_count;
    local_c8 = slen;
    do {
      ilen = local_c8;
      uVar2 = local_dc;
      iVar4 = mbedtls_md_hmac_starts(ctx,password,local_d0);
      if (iVar4 != 0) {
        return iVar4;
      }
      iVar4 = mbedtls_md_hmac_update(ctx,local_c0,ilen);
      if (iVar4 != 0) {
        return iVar4;
      }
      iVar4 = mbedtls_md_hmac_update(ctx,local_e0,4);
      if (iVar4 != 0) {
        return iVar4;
      }
      iVar4 = mbedtls_md_hmac_finish(ctx,local_b8);
      if (iVar4 != 0) {
        return iVar4;
      }
      memcpy(local_78,local_b8,__n);
      if (1 < uVar2) {
        uVar7 = 1;
        do {
          iVar4 = mbedtls_md_hmac_starts(ctx,password,local_d0);
          if (iVar4 != 0) {
            return iVar4;
          }
          iVar4 = mbedtls_md_hmac_update(ctx,local_78,__n);
          if (iVar4 != 0) {
            return iVar4;
          }
          iVar4 = mbedtls_md_hmac_finish(ctx,local_78);
          if (iVar4 != 0) {
            return iVar4;
          }
          if (bVar3 != 0) {
            uVar5 = 0;
            do {
              local_b8[uVar5] = local_b8[uVar5] ^ local_78[uVar5];
              uVar5 = uVar5 + 1;
            } while (__n != uVar5);
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar2);
      }
      puVar1 = local_d8;
      uVar2 = (uint)bVar3;
      if (local_e4 < bVar3) {
        uVar2 = local_e4;
      }
      memcpy(local_d8,local_b8,(ulong)uVar2);
      local_e4 = local_e4 - uVar2;
      local_d8 = puVar1 + uVar2;
      uVar5 = 3;
      do {
        if (uVar5 == 0xffffffffffffffff) break;
        uVar6 = uVar5 & 0xffffffff;
        uVar5 = uVar5 - 1;
        puVar1 = local_e0 + uVar6;
        *puVar1 = *puVar1 + '\x01';
      } while (*puVar1 == '\0');
    } while (local_e4 != 0);
  }
  return 0;
}

Assistant:

int mbedtls_pkcs5_pbkdf2_hmac( mbedtls_md_context_t *ctx, const unsigned char *password,
                       size_t plen, const unsigned char *salt, size_t slen,
                       unsigned int iteration_count,
                       uint32_t key_length, unsigned char *output )
{
    int ret, j;
    unsigned int i;
    unsigned char md1[MBEDTLS_MD_MAX_SIZE];
    unsigned char work[MBEDTLS_MD_MAX_SIZE];
    unsigned char md_size = mbedtls_md_get_size( ctx->md_info );
    size_t use_len;
    unsigned char *out_p = output;
    unsigned char counter[4];

    memset( counter, 0, 4 );
    counter[3] = 1;

    if( iteration_count > 0xFFFFFFFF )
        return( MBEDTLS_ERR_PKCS5_BAD_INPUT_DATA );

    while( key_length )
    {
        // U1 ends up in work
        //
        if( ( ret = mbedtls_md_hmac_starts( ctx, password, plen ) ) != 0 )
            return( ret );

        if( ( ret = mbedtls_md_hmac_update( ctx, salt, slen ) ) != 0 )
            return( ret );

        if( ( ret = mbedtls_md_hmac_update( ctx, counter, 4 ) ) != 0 )
            return( ret );

        if( ( ret = mbedtls_md_hmac_finish( ctx, work ) ) != 0 )
            return( ret );

        memcpy( md1, work, md_size );

        for( i = 1; i < iteration_count; i++ )
        {
            // U2 ends up in md1
            //
            if( ( ret = mbedtls_md_hmac_starts( ctx, password, plen ) ) != 0 )
                return( ret );

            if( ( ret = mbedtls_md_hmac_update( ctx, md1, md_size ) ) != 0 )
                return( ret );

            if( ( ret = mbedtls_md_hmac_finish( ctx, md1 ) ) != 0 )
                return( ret );

            // U1 xor U2
            //
            for( j = 0; j < md_size; j++ )
                work[j] ^= md1[j];
        }

        use_len = ( key_length < md_size ) ? key_length : md_size;
        memcpy( out_p, work, use_len );

        key_length -= (uint32_t) use_len;
        out_p += use_len;

        for( i = 4; i > 0; i-- )
            if( ++counter[i - 1] != 0 )
                break;
    }

    return( 0 );
}